

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto)

{
  FileDescriptor *pFVar1;
  DescriptorBuilder local_d0;
  
  internal::Mutex::AssertHeld(this->mutex_);
  local_d0.error_collector_ = this->default_error_collector_;
  local_d0.tables_ = (this->tables_).ptr_;
  local_d0.filename_._M_dataplus._M_p = (pointer)&local_d0.filename_.field_2;
  local_d0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_d0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_d0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_d0._41_8_ = 0;
  local_d0.filename_._M_string_length = 0;
  local_d0.filename_.field_2._M_local_buf[0] = '\0';
  local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0.possible_undeclared_dependency_name_._M_dataplus._M_p =
       (pointer)&local_d0.possible_undeclared_dependency_name_.field_2;
  local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0.possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_d0.possible_undeclared_dependency_name_._M_string_length = 0;
  local_d0.possible_undeclared_dependency_name_.field_2._M_local_buf[0] = '\0';
  local_d0.pool_ = this;
  local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar1 = DescriptorBuilder::BuildFile(&local_d0,proto);
  DescriptorBuilder::~DescriptorBuilder(&local_d0);
  return pFVar1;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto) const {
  mutex_->AssertHeld();
  return DescriptorBuilder(this, tables_.get(),
                           default_error_collector_).BuildFile(proto);
}